

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_add_ge_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *rzr)

{
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  secp256k1_fe *b_00;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  secp256k1_fe s1;
  secp256k1_fe u1;
  secp256k1_fe i2;
  secp256k1_fe s2;
  secp256k1_fe h2;
  secp256k1_fe u2;
  secp256k1_fe z12;
  secp256k1_fe t;
  secp256k1_fe local_238;
  secp256k1_fe local_208;
  uint64_t local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  uint64_t local_1b0;
  ulong local_1a8;
  secp256k1_fe *local_1a0;
  secp256k1_fe local_198;
  secp256k1_fe local_170;
  secp256k1_fe local_148;
  secp256k1_fe local_120;
  secp256k1_fe local_f8;
  secp256k1_fe local_d0;
  secp256k1_fe local_a8;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  if (a->infinity == 0) {
    if (b->infinity == 0) {
      r->infinity = 0;
      local_1a0 = &a->z;
      secp256k1_fe_sqr(&local_80,local_1a0);
      uVar1 = (a->x).n[4];
      local_208.n[0] = (uVar1 >> 0x30) * 0x1000003d1 + (a->x).n[0];
      local_208.n[1] = (local_208.n[0] >> 0x34) + (a->x).n[1];
      local_208.n[2] = (local_208.n[1] >> 0x34) + (a->x).n[2];
      local_208.n[0] = local_208.n[0] & 0xfffffffffffff;
      local_208.n[1] = local_208.n[1] & 0xfffffffffffff;
      local_208.n[3] = (local_208.n[2] >> 0x34) + (a->x).n[3];
      local_208.n[2] = local_208.n[2] & 0xfffffffffffff;
      local_208.n[4] = (local_208.n[3] >> 0x34) + (uVar1 & 0xffffffffffff);
      local_208.n[3] = local_208.n[3] & 0xfffffffffffff;
      local_1c8 = local_208.n[0];
      local_1c0 = local_208.n[1];
      local_1b8 = local_208.n[2];
      local_1b0 = local_208.n[4];
      local_1a8 = local_208.n[3];
      secp256k1_fe_mul(&local_a8,&b->x,&local_80);
      b_00 = local_1a0;
      uVar1 = (a->y).n[4];
      uVar8 = (uVar1 >> 0x30) * 0x1000003d1 + (a->y).n[0];
      uVar9 = (uVar8 >> 0x34) + (a->y).n[1];
      uVar8 = uVar8 & 0xfffffffffffff;
      uVar10 = (uVar9 >> 0x34) + (a->y).n[2];
      local_238.n[3] = (uVar10 >> 0x34) + (a->y).n[3];
      uVar9 = uVar9 & 0xfffffffffffff;
      uVar10 = uVar10 & 0xfffffffffffff;
      local_238.n[4] = (local_238.n[3] >> 0x34) + (uVar1 & 0xffffffffffff);
      local_238.n[3] = local_238.n[3] & 0xfffffffffffff;
      local_238.n[0] = uVar8;
      local_238.n[1] = uVar9;
      local_238.n[2] = uVar10;
      local_1d8 = local_238.n[4];
      local_1d0 = local_238.n[3];
      secp256k1_fe_mul(&local_120,&b->y,&local_80);
      secp256k1_fe_mul(&local_120,&local_120,b_00);
      local_170.n[0] = (local_a8.n[0] - local_1c8) + 0x3ffffbfffff0bc;
      local_170.n[1] = (local_a8.n[1] - local_1c0) + 0x3ffffffffffffc;
      local_170.n[2] = (local_a8.n[2] - local_1b8) + 0x3ffffffffffffc;
      local_170.n[3] = (local_a8.n[3] - local_1a8) + 0x3ffffffffffffc;
      local_170.n[4] = (local_a8.n[4] - local_1b0) + 0x3fffffffffffc;
      local_198.n[0] = (local_120.n[0] - uVar8) + 0x3ffffbfffff0bc;
      local_198.n[1] = (local_120.n[1] - uVar9) + 0x3ffffffffffffc;
      local_198.n[2] = (local_120.n[2] - uVar10) + 0x3ffffffffffffc;
      local_198.n[3] = (local_120.n[3] - local_1d0) + 0x3ffffffffffffc;
      local_198.n[4] = (local_120.n[4] - local_1d8) + 0x3fffffffffffc;
      iVar6 = secp256k1_fe_normalizes_to_zero_var(&local_170);
      if (iVar6 == 0) {
        secp256k1_fe_sqr(&local_148,&local_198);
        secp256k1_fe_sqr(&local_d0,&local_170);
        secp256k1_fe_mul(&local_f8,&local_170,&local_d0);
        if (rzr != (secp256k1_fe *)0x0) {
          rzr->n[4] = local_170.n[4];
          rzr->n[2] = local_170.n[2];
          rzr->n[3] = local_170.n[3];
          rzr->n[0] = local_170.n[0];
          rzr->n[1] = local_170.n[1];
        }
        secp256k1_fe_mul(&r->z,b_00,&local_170);
        secp256k1_fe_mul(&local_58,&local_208,&local_d0);
        (r->x).n[4] = local_58.n[4];
        (r->x).n[2] = local_58.n[2];
        (r->x).n[3] = local_58.n[3];
        (r->x).n[0] = local_58.n[0];
        (r->x).n[1] = local_58.n[1];
        lVar11 = local_148.n[0] - ((r->x).n[0] * 2 + local_f8.n[0]);
        lVar12 = local_148.n[1] - ((r->x).n[1] * 2 + local_f8.n[1]);
        (r->x).n[0] = lVar11 + 0x7ffff7ffffe178;
        (r->x).n[1] = lVar12 + 0x7ffffffffffff8;
        lVar13 = local_148.n[2] - ((r->x).n[2] * 2 + local_f8.n[2]);
        lVar14 = local_148.n[3] - ((r->x).n[3] * 2 + local_f8.n[3]);
        (r->x).n[2] = lVar13 + 0x7ffffffffffff8;
        (r->x).n[3] = lVar14 + 0x7ffffffffffff8;
        lVar7 = local_148.n[4] - (local_58.n[4] * 2 + local_f8.n[4]);
        (r->x).n[4] = lVar7 + 0x7fffffffffff8;
        (r->y).n[0] = (local_58.n[0] - lVar11) + 0x3ffffbfffff0bc;
        (r->y).n[1] = (local_58.n[1] - lVar12) + 0x3ffffffffffffc;
        (r->y).n[2] = (local_58.n[2] - lVar13) + 0x3ffffffffffffc;
        (r->y).n[3] = (local_58.n[3] - lVar14) + 0x3ffffffffffffc;
        (r->y).n[4] = (local_58.n[4] - lVar7) + 0x3fffffffffffc;
        secp256k1_fe_mul(&r->y,&r->y,&local_198);
        secp256k1_fe_mul(&local_f8,&local_f8,&local_238);
        uVar3 = (r->y).n[1];
        uVar4 = (r->y).n[2];
        uVar5 = (r->y).n[3];
        uVar2 = (r->y).n[4];
        (r->y).n[0] = ((r->y).n[0] - local_f8.n[0]) + 0x3ffffbfffff0bc;
        (r->y).n[1] = (uVar3 - local_f8.n[1]) + 0x3ffffffffffffc;
        (r->y).n[2] = (uVar4 - local_f8.n[2]) + 0x3ffffffffffffc;
        (r->y).n[3] = (uVar5 - local_f8.n[3]) + 0x3ffffffffffffc;
        (r->y).n[4] = (uVar2 - local_f8.n[4]) + 0x3fffffffffffc;
      }
      else {
        iVar6 = secp256k1_fe_normalizes_to_zero_var(&local_198);
        if (iVar6 != 0) {
          secp256k1_gej_double_var(r,a,rzr);
          return;
        }
        if (rzr != (secp256k1_fe *)0x0) {
          rzr->n[2] = 0;
          rzr->n[3] = 0;
          rzr->n[0] = 0;
          rzr->n[1] = 0;
          rzr->n[4] = 0;
        }
        r->infinity = 1;
      }
    }
    else {
      if (rzr != (secp256k1_fe *)0x0) {
        rzr->n[0] = 1;
        rzr->n[1] = 0;
        rzr->n[2] = 0;
        rzr->n[3] = 0;
        rzr->n[4] = 0;
      }
      for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
        (r->x).n[0] = (a->x).n[0];
        a = (secp256k1_gej *)((a->x).n + 1);
        r = (secp256k1_gej *)((r->x).n + 1);
      }
    }
  }
  else {
    r->infinity = b->infinity;
    uVar2 = (b->x).n[1];
    uVar3 = (b->x).n[2];
    uVar4 = (b->x).n[3];
    (r->x).n[0] = (b->x).n[0];
    (r->x).n[1] = uVar2;
    (r->x).n[2] = uVar3;
    (r->x).n[3] = uVar4;
    (r->x).n[4] = (b->x).n[4];
    uVar2 = (b->y).n[1];
    uVar3 = (b->y).n[2];
    uVar4 = (b->y).n[3];
    (r->y).n[0] = (b->y).n[0];
    (r->y).n[1] = uVar2;
    (r->y).n[2] = uVar3;
    (r->y).n[3] = uVar4;
    (r->y).n[4] = (b->y).n[4];
    (r->z).n[0] = 1;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
  }
  return;
}

Assistant:

static void secp256k1_gej_add_ge_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, secp256k1_fe *rzr) {
    /* 8 mul, 3 sqr, 4 normalize, 12 mul_int/add/negate */
    secp256k1_fe z12, u1, u2, s1, s2, h, i, i2, h2, h3, t;
    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        secp256k1_gej_set_ge(r, b);
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }
    r->infinity = 0;

    secp256k1_fe_sqr(&z12, &a->z);
    u1 = a->x; secp256k1_fe_normalize_weak(&u1);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y; secp256k1_fe_normalize_weak(&s1);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s1, 1); secp256k1_fe_add(&i, &s2);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            r->infinity = 1;
        }
        return;
    }
    secp256k1_fe_sqr(&i2, &i);
    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_mul(&h3, &h, &h2);
    if (rzr != NULL) {
        *rzr = h;
    }
    secp256k1_fe_mul(&r->z, &a->z, &h);
    secp256k1_fe_mul(&t, &u1, &h2);
    r->x = t; secp256k1_fe_mul_int(&r->x, 2); secp256k1_fe_add(&r->x, &h3); secp256k1_fe_negate(&r->x, &r->x, 3); secp256k1_fe_add(&r->x, &i2);
    secp256k1_fe_negate(&r->y, &r->x, 5); secp256k1_fe_add(&r->y, &t); secp256k1_fe_mul(&r->y, &r->y, &i);
    secp256k1_fe_mul(&h3, &h3, &s1); secp256k1_fe_negate(&h3, &h3, 1);
    secp256k1_fe_add(&r->y, &h3);
}